

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void __thiscall PosixRunWriter::~PosixRunWriter(PosixRunWriter *this)

{
  if ((this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  spdlog::error<char[46]>((char (*) [46])"PosixRunWriter not flushed before destructing");
  std::terminate();
}

Assistant:

PosixRunWriter::~PosixRunWriter() {
    if (!buffer_.empty()) {
        // PosixRunWriter buffer not flushed, fatal error.
        spdlog::error("PosixRunWriter not flushed before destructing");
        std::terminate();
    }
}